

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
               *src,assign_op<double,_double> *func)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  ulong cols;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  uVar8 = (src->m_expression).m_rhs.m_rows.m_value;
  pdVar3 = (((src->m_expression).m_lhs.m_expression)->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  dVar1 = (src->m_expression).m_rhs.m_functor.m_other;
  cols = (src->m_expression).m_rhs.m_cols.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar8) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    if ((long)(cols | uVar8) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar8 != 0) &&
       (auVar11 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar11 / SEXT816((long)cols),0) < (long)uVar8)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar11 % SEXT816((long)cols),0))
      ;
      *puVar7 = std::random_device::_M_fini;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar8,uVar8,cols);
  }
  uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar4 == uVar8) &&
     (uVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar8 == cols)) {
    pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar6 = uVar8 * uVar4;
    uVar8 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar6) {
      lVar9 = 0;
      do {
        auVar11._8_8_ = dVar1;
        auVar11._0_8_ = dVar1;
        auVar11 = maxpd(*(undefined1 (*) [16])(pdVar3 + lVar9),auVar11);
        *(undefined1 (*) [16])(pdVar5 + lVar9) = auVar11;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar8);
    }
    if ((long)uVar8 < lVar6) {
      do {
        dVar2 = pdVar3[uVar8];
        dVar10 = dVar1;
        if (dVar1 <= dVar2) {
          dVar10 = dVar2;
        }
        pdVar5[uVar8] = dVar10;
        uVar8 = uVar8 + 1;
      } while (lVar6 - uVar8 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, -1>>>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}